

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

string * __thiscall
cfd::core::DescriptorNode::GenerateChecksum
          (string *__return_storage_ptr__,DescriptorNode *this,string *descriptor)

{
  string *psVar1;
  int j;
  anon_class_1_0_00000001 *this_00;
  long lVar2;
  long lVar3;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [12];
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                   kInputCharset_abi_cxx11_), descriptor = extraout_RDX_03,
     iVar6 != 0)) {
    ::std::__cxx11::string::string
              ((string *)&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
               "0123456789()[],\'/*abcdefgh@:$%{}IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~ijklmnopqrstuvwxyzABCDEFGH`#\"\\ "
               ,&local_39);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_);
    descriptor = extraout_RDX_04;
  }
  if ((GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GenerateChecksum(std::__cxx11::string_const&)::
                                   kChecksumCharset_abi_cxx11_), descriptor = extraout_RDX_05,
     iVar6 != 0)) {
    ::std::__cxx11::string::string
              ((string *)&GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_
               ,"qpzry9x8gf2tvdw0s3jn54khce6mua7l",&local_3a);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_)
    ;
    descriptor = extraout_RDX_06;
  }
  uVar5 = 0;
  this_00 = (anon_class_1_0_00000001 *)0x1;
  iVar6 = 0;
  uVar4 = 0;
  while( true ) {
    if ((this->name_)._M_string_length <= uVar4) {
      if (0 < iVar6) {
        this_00 = (anon_class_1_0_00000001 *)
                  GenerateChecksum::anon_class_1_0_00000001::operator()
                            (this_00,(ulong)uVar5,(int)descriptor);
        descriptor = extraout_RDX_01;
      }
      psVar1 = local_38;
      iVar6 = 8;
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        this_00 = (anon_class_1_0_00000001 *)
                  GenerateChecksum::anon_class_1_0_00000001::operator()(this_00,0,(int)descriptor);
        descriptor = extraout_RDX_02;
      }
      (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
      ::std::__cxx11::string::_M_construct((ulong)psVar1,'\b');
      lVar2 = 0;
      for (lVar3 = 0x23; lVar3 != -5; lVar3 = lVar3 + -5) {
        (psVar1->_M_dataplus)._M_p[lVar2] =
             GenerateChecksum(std::__cxx11::string_const&)::kChecksumCharset_abi_cxx11_._M_dataplus.
             _M_p[(uint)(((ulong)this_00 ^ 1) >> ((byte)lVar3 & 0x3f)) & 0x1f];
        lVar2 = lVar2 + 1;
      }
      return psVar1;
    }
    auVar8 = ::std::__cxx11::string::find
                       ('\b',(ulong)(uint)(int)(this->name_)._M_dataplus._M_p[uVar4]);
    psVar1 = local_38;
    if (auVar8._0_8_ == 0xffffffffffffffff) break;
    this_00 = (anon_class_1_0_00000001 *)
              GenerateChecksum::anon_class_1_0_00000001::operator()
                        (this_00,(ulong)(auVar8._0_4_ & 0x1f),auVar8._8_4_);
    uVar5 = (int)(auVar8._0_8_ >> 5) + uVar5 * 3;
    iVar6 = iVar6 + 1;
    descriptor = extraout_RDX;
    if (iVar6 == 3) {
      this_00 = (anon_class_1_0_00000001 *)
                GenerateChecksum::anon_class_1_0_00000001::operator()
                          (this_00,(ulong)uVar5,(int)extraout_RDX);
      uVar5 = 0;
      iVar6 = 0;
      descriptor = extraout_RDX_00;
    }
    uVar4 = uVar4 + 1;
  }
  ::std::__cxx11::string::string((string *)local_38,"",&local_3b);
  return psVar1;
}

Assistant:

std::string DescriptorNode::GenerateChecksum(const std::string& descriptor) {
  // base
  // bitcoin/src/script/descriptor.cpp
  // std::string DescriptorChecksum(const Span<const char>& span)

  /** A character set designed such that:
   *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
   *  - Case errors cause an offset that's a multiple of 32.
   *  - As many alphabetic characters are in the same group (while following the above restrictions).
   *
   * If p(x) gives the position of a character c in this character set, every group of 3 characters
   * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
   * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
   * affect a single symbol.
   *
   * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
   * the position within the groups.
   */
  static const std::string kInputCharset =
      "0123456789()[],'/*abcdefgh@:$%{}"
      "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
      "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

  /** The character set for the checksum itself (same as bech32). */
  static const std::string kChecksumCharset =
      "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

  static auto poly_mod = [](uint64_t c, int val) -> uint64_t {
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
  };

  uint64_t c = 1;
  int cls = 0;
  int clscount = 0;
  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& ch = descriptor[idx];
    auto pos = kInputCharset.find(ch);
    if (pos == std::string::npos) return "";
    // Emit a symbol for the position inside the group, for every character.
    c = poly_mod(c, pos & 31);
    // Accumulate the group numbers
    cls = cls * 3 + static_cast<int>(pos >> 5);
    if (++clscount == 3) {
      // NOLINT Emit an extra symbol representing the group numbers, for every 3 characters.
      c = poly_mod(c, cls);
      cls = 0;
      clscount = 0;
    }
  }
  if (clscount > 0) c = poly_mod(c, cls);
  // Shift further to determine the checksum.
  for (int j = 0; j < 8; ++j) c = poly_mod(c, 0);
  // Prevent appending zeroes from not affecting the checksum.
  c ^= 1;

  std::string ret(8, ' ');
  for (int j = 0; j < 8; ++j)
    ret[j] = kChecksumCharset[(c >> (5 * (7 - j))) & 31];

  return ret;
}